

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

char * next_option(char *list,vec *val,vec *eq_val)

{
  char *pcVar1;
  size_t sVar2;
  bool bVar3;
  int local_2c;
  int end;
  vec *eq_val_local;
  vec *val_local;
  char *list_local;
  
  val_local = (vec *)list;
  do {
    if (((val == (vec *)0x0) || (val_local == (vec *)0x0)) || (*(char *)&val_local->ptr == '\0')) {
      return (char *)0x0;
    }
    while( true ) {
      bVar3 = true;
      if (*(char *)&val_local->ptr != ' ') {
        bVar3 = *(char *)&val_local->ptr == '\t';
      }
      if (!bVar3) break;
      val_local = (vec *)((long)&val_local->ptr + 1);
    }
    val->ptr = (char *)val_local;
    pcVar1 = strchr(val->ptr,0x2c);
    if (pcVar1 == (char *)0x0) {
      pcVar1 = val->ptr;
      sVar2 = strlen(val->ptr);
      val_local = (vec *)(pcVar1 + sVar2);
      val->len = (long)val_local - (long)val->ptr;
    }
    else {
      val->len = (long)pcVar1 - (long)val->ptr;
      val_local = (vec *)(pcVar1 + 1);
    }
    local_2c = (int)val->len;
    do {
      local_2c = local_2c + -1;
      bVar3 = false;
      if ((-1 < local_2c) && (bVar3 = true, val->ptr[local_2c] != ' ')) {
        bVar3 = val->ptr[local_2c] == '\t';
      }
    } while (bVar3);
    val->len = (long)local_2c + 1;
  } while (val->len == 0);
  if (eq_val != (vec *)0x0) {
    eq_val->len = 0;
    pcVar1 = (char *)memchr(val->ptr,0x3d,val->len);
    eq_val->ptr = pcVar1;
    if (eq_val->ptr != (char *)0x0) {
      eq_val->ptr = eq_val->ptr + 1;
      eq_val->len = (size_t)(val->ptr + (val->len - (long)eq_val->ptr));
      val->len = (size_t)(eq_val->ptr + (-1 - (long)val->ptr));
    }
  }
  return (char *)val_local;
}

Assistant:

static const char *
next_option(const char *list, struct vec *val, struct vec *eq_val)
{
	int end;

reparse:
	if (val == NULL || list == NULL || *list == '\0') {
		/* End of the list */
		return NULL;
	}

	/* Skip over leading LWS */
	while (*list == ' ' || *list == '\t')
		list++;

	val->ptr = list;
	if ((list = strchr(val->ptr, ',')) != NULL) {
		/* Comma found. Store length and shift the list ptr */
		val->len = ((size_t)(list - val->ptr));
		list++;
	} else {
		/* This value is the last one */
		list = val->ptr + strlen(val->ptr);
		val->len = ((size_t)(list - val->ptr));
	}

	/* Adjust length for trailing LWS */
	end = (int)val->len - 1;
	while (end >= 0 && ((val->ptr[end] == ' ') || (val->ptr[end] == '\t')))
		end--;
	val->len = (size_t)(end) + (size_t)(1);

	if (val->len == 0) {
		/* Ignore any empty entries. */
		goto reparse;
	}

	if (eq_val != NULL) {
		/* Value has form "x=y", adjust pointers and lengths
		 * so that val points to "x", and eq_val points to "y". */
		eq_val->len = 0;
		eq_val->ptr = (const char *)memchr(val->ptr, '=', val->len);
		if (eq_val->ptr != NULL) {
			eq_val->ptr++; /* Skip over '=' character */
			eq_val->len = ((size_t)(val->ptr - eq_val->ptr)) + val->len;
			val->len = ((size_t)(eq_val->ptr - val->ptr)) - 1;
		}
	}

	return list;
}